

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

void xmlHashScanFull3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3,
                     xmlHashScannerFull f,void *data)

{
  _xmlHashEntry *p_Var1;
  int iVar2;
  long lVar3;
  _xmlHashEntry *p_Var4;
  
  if ((f != (xmlHashScannerFull)0x0 && table != (xmlHashTablePtr)0x0) &&
     (table->table != (_xmlHashEntry *)0x0)) {
    for (lVar3 = 0; lVar3 < table->size; lVar3 = lVar3 + 1) {
      if (table->table[lVar3].valid != 0) {
        p_Var1 = table->table + lVar3;
LAB_00148a6b:
        p_Var4 = p_Var1;
        if (p_Var4 != (_xmlHashEntry *)0x0) {
          p_Var1 = p_Var4->next;
          if (name != (xmlChar *)0x0) goto code_r0x00148a7b;
          goto LAB_00148a8b;
        }
      }
    }
  }
  return;
code_r0x00148a7b:
  iVar2 = xmlStrEqual(name,p_Var4->name);
  if (iVar2 != 0) {
LAB_00148a8b:
    if (name2 != (xmlChar *)0x0) {
      iVar2 = xmlStrEqual(name2,p_Var4->name2);
      if (iVar2 == 0) goto LAB_00148a6b;
    }
    if (name3 != (xmlChar *)0x0) {
      iVar2 = xmlStrEqual(name3,p_Var4->name3);
      if (iVar2 == 0) goto LAB_00148a6b;
    }
    if (p_Var4->payload != (void *)0x0) {
      (*f)(p_Var4->payload,data,p_Var4->name,p_Var4->name2,p_Var4->name3);
    }
  }
  goto LAB_00148a6b;
}

Assistant:

void
xmlHashScanFull3(xmlHashTablePtr table, const xmlChar *name,
		 const xmlChar *name2, const xmlChar *name3,
		 xmlHashScannerFull f, void *data) {
    int i;
    xmlHashEntryPtr iter;
    xmlHashEntryPtr next;

    if (table == NULL)
	return;
    if (f == NULL)
	return;

    if (table->table) {
	for(i = 0; i < table->size; i++) {
	    if (table->table[i].valid == 0)
		continue;
	    iter = &(table->table[i]);
	    while (iter) {
		next = iter->next;
		if (((name == NULL) || (xmlStrEqual(name, iter->name))) &&
		    ((name2 == NULL) || (xmlStrEqual(name2, iter->name2))) &&
		    ((name3 == NULL) || (xmlStrEqual(name3, iter->name3))) &&
		    (iter->payload != NULL)) {
		    f(iter->payload, data, iter->name,
		      iter->name2, iter->name3);
		}
		iter = next;
	    }
	}
    }
}